

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

_Bool imap_matchresp(char *line,size_t len,char *cmd)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  size_t max;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  pcVar1 = line + len;
  max = strlen(cmd);
  pcVar6 = line + 2;
  if ((2 < (long)len) && ((byte)(*pcVar6 - 0x30U) < 10)) {
    pcVar6 = line + 3;
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      pcVar4 = pcVar6;
      if (pcVar1 <= pcVar4) break;
      pcVar6 = pcVar4 + 1;
      lVar2 = lVar5 + -1;
    } while ((byte)(*pcVar4 - 0x30U) < 10);
    if (3 - len == lVar5) {
      return false;
    }
    if (*pcVar4 != ' ') {
      return false;
    }
    pcVar6 = line + (4 - lVar5);
  }
  pcVar4 = pcVar6 + max;
  if (((pcVar4 <= pcVar1) && (iVar3 = curl_strnequal(pcVar6,cmd,max), iVar3 != 0)) &&
     (pcVar4 + 2 == pcVar1 || *pcVar4 == ' ')) {
    return true;
  }
  return false;
}

Assistant:

static bool imap_matchresp(const char *line, size_t len, const char *cmd)
{
  const char *end = line + len;
  size_t cmd_len = strlen(cmd);

  /* Skip the untagged response marker */
  line += 2;

  /* Do we have a number after the marker? */
  if(line < end && ISDIGIT(*line)) {
    /* Skip the number */
    do
      line++;
    while(line < end && ISDIGIT(*line));

    /* Do we have the space character? */
    if(line == end || *line != ' ')
      return FALSE;

    line++;
  }

  /* Does the command name match and is it followed by a space character or at
     the end of line? */
  if(line + cmd_len <= end && strncasecompare(line, cmd, cmd_len) &&
     (line[cmd_len] == ' ' || line + cmd_len + 2 == end))
    return TRUE;

  return FALSE;
}